

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O0

size_t ecNAFWidth(size_t l)

{
  size_t l_local;
  undefined8 local_8;
  
  if (l < 0x150) {
    if (l < 0x78) {
      if (l < 0x28) {
        local_8 = 3;
      }
      else {
        local_8 = 4;
      }
    }
    else {
      local_8 = 5;
    }
  }
  else {
    local_8 = 6;
  }
  return local_8;
}

Assistant:

static size_t ecNAFWidth(size_t l)
{
	if (l >= 336)
		return 6;
	else if (l >= 120)
		return 5;
	else if (l >= 40)
		return 4;
	return 3;
}